

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<float>_>::DecomposeColumn
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t col,int64_t prevcol)

{
  complex<float> **ppcVar1;
  long lVar2;
  long lVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  float fVar8;
  undefined8 uVar6;
  _ComplexT _Var7;
  undefined4 extraout_XMM0_Db;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  ppcVar1 = (this->fElem).fStore;
  pcVar5 = ppcVar1[prevcol];
  pcVar4 = ppcVar1[col];
  lVar2 = (prevcol - ((long)ppcVar1[prevcol + 1] - (long)pcVar5 >> 3)) + 1;
  lVar3 = (col - ((long)ppcVar1[col + 1] - (long)pcVar4 >> 3)) + 1;
  if (lVar3 < lVar2) {
    lVar3 = lVar2;
  }
  if (prevcol < lVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error condition\n",0x10);
    std::ostream::flush();
    return;
  }
  if (prevcol == lVar3) {
    pcVar4 = pcVar4 + (col - lVar3);
    fVar11 = 0.0;
    fVar12 = 0.0;
  }
  else {
    pcVar4 = pcVar4 + col;
    pcVar5 = pcVar5 + prevcol;
    lVar2 = prevcol * -8;
    fVar11 = 0.0;
    fVar12 = 0.0;
    do {
      _Var7 = pcVar5[-lVar3]._M_value;
      fVar9 = *(float *)((long)&pcVar4[-lVar3]._M_value + 4);
      fVar8 = (float)(_Var7 >> 0x20);
      fVar10 = *(float *)&pcVar4[-lVar3]._M_value * (float)_Var7 - fVar8 * fVar9;
      fVar9 = *(float *)&pcVar4[-lVar3]._M_value * fVar8 + (float)_Var7 * fVar9;
      if ((NAN(fVar10)) && (NAN(fVar9))) {
        uVar6 = __mulsc3(_Var7,fVar8);
        fVar10 = (float)uVar6;
        fVar9 = (float)((ulong)uVar6 >> 0x20);
      }
      fVar11 = fVar11 + fVar10;
      fVar12 = fVar12 + fVar9;
      pcVar4 = pcVar4 + -1;
      pcVar5 = pcVar5 + -1;
      lVar2 = lVar2 + 8;
    } while (-lVar2 != lVar3 * 8);
    pcVar4 = pcVar4 + -lVar3;
    pcVar5 = pcVar5 + -lVar3;
  }
  fVar11 = (float)pcVar4->_M_value - fVar11;
  fVar12 = (float)(pcVar4->_M_value >> 0x20) - fVar12;
  _Var7 = CONCAT44(fVar12,fVar11);
  pcVar4->_M_value = _Var7;
  if (pcVar5 == pcVar4) {
    fVar11 = csqrtf(fVar11);
    _Var7 = CONCAT44(extraout_XMM0_Db,fVar11);
  }
  else {
    _Var7 = __divsc3(_Var7,fVar12,(int)pcVar5->_M_value,*(undefined4 *)((long)&pcVar5->_M_value + 4)
                    );
  }
  pcVar4->_M_value = _Var7;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        *run2=sqrt(*run2);
    }
    
}